

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_export_secret(ptls_t *tls,void *output,size_t outlen,char *label,ptls_iovec_t context_value
                      ,int is_early)

{
  uint8_t *puVar1;
  ptls_hash_algorithm_t *algo;
  size_t outlen_00;
  ptls_iovec_t hash_value;
  ptls_iovec_t hash_value_00;
  int iVar2;
  ptls_hash_context_t *ppVar3;
  ptls_iovec_t secret;
  ptls_iovec_t secret_00;
  uint8_t derived_secret [64];
  uint8_t context_value_hash [64];
  uint8_t local_b8 [64];
  uint8_t local_78 [72];
  
  puVar1 = *(uint8_t **)((tls->ech).inner_client_random + (ulong)(is_early == 0) * 8 + -0x30);
  if (puVar1 == (uint8_t *)0x0) {
    if (is_early == 0) {
      iVar2 = 0x202;
    }
    else {
      iVar2 = (uint)((tls->state & ~PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO) !=
                    PTLS_STATE_CLIENT_HANDSHAKE_START) * 5 + 0x202;
    }
  }
  else {
    algo = tls->key_schedule->hashes[0].algo;
    ppVar3 = (*algo->create)();
    if (ppVar3 == (ptls_hash_context_t *)0x0) {
      iVar2 = 0x201;
    }
    else {
      (*ppVar3->update)(ppVar3,context_value.base,context_value.len);
      (*ppVar3->final)(ppVar3,local_78,PTLS_HASH_FINAL_MODE_FREE);
      outlen_00 = algo->digest_size;
      hash_value.len = outlen_00;
      hash_value.base = algo->empty_digest;
      secret.len = outlen_00;
      secret.base = puVar1;
      iVar2 = ptls_hkdf_expand_label(algo,local_b8,outlen_00,secret,label,hash_value,(char *)0x0);
      if (iVar2 == 0) {
        hash_value_00.len = algo->digest_size;
        hash_value_00.base = local_78;
        secret_00.len = algo->digest_size;
        secret_00.base = local_b8;
        iVar2 = ptls_hkdf_expand_label
                          (algo,output,outlen,secret_00,"exporter",hash_value_00,(char *)0x0);
      }
      (*ptls_clear_memory)(local_b8,0x40);
      (*ptls_clear_memory)(local_78,0x40);
    }
  }
  return iVar2;
}

Assistant:

int ptls_export_secret(ptls_t *tls, void *output, size_t outlen, const char *label, ptls_iovec_t context_value, int is_early)
{
    ptls_hash_algorithm_t *algo = tls->key_schedule->hashes[0].algo;
    uint8_t *master_secret = is_early ? tls->exporter_master_secret.early : tls->exporter_master_secret.one_rtt,
            derived_secret[PTLS_MAX_DIGEST_SIZE], context_value_hash[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if (master_secret == NULL) {
        if (is_early) {
            switch (tls->state) {
            case PTLS_STATE_CLIENT_HANDSHAKE_START:
            case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
                ret = PTLS_ERROR_IN_PROGRESS;
                break;
            default:
                ret = PTLS_ERROR_NOT_AVAILABLE;
                break;
            }
        } else {
            ret = PTLS_ERROR_IN_PROGRESS;
        }
        return ret;
    }

    if ((ret = ptls_calc_hash(algo, context_value_hash, context_value.base, context_value.len)) != 0)
        return ret;

    if ((ret = ptls_hkdf_expand_label(algo, derived_secret, algo->digest_size, ptls_iovec_init(master_secret, algo->digest_size),
                                      label, ptls_iovec_init(algo->empty_digest, algo->digest_size), NULL)) != 0)
        goto Exit;
    ret = ptls_hkdf_expand_label(algo, output, outlen, ptls_iovec_init(derived_secret, algo->digest_size), "exporter",
                                 ptls_iovec_init(context_value_hash, algo->digest_size), NULL);

Exit:
    ptls_clear_memory(derived_secret, sizeof(derived_secret));
    ptls_clear_memory(context_value_hash, sizeof(context_value_hash));
    return ret;
}